

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void ravi_pushcfastcall(lua_State *L,void *ptr,int tag)

{
  StkId pTVar1;
  int iVar2;
  TValue *io;
  int tag_local;
  void *ptr_local;
  lua_State *L_local;
  
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x23d,"void ravi_pushcfastcall(lua_State *, void *, int)");
  }
  pTVar1 = L->top;
  if ((tag < 1) || (0x7f < tag)) {
    __assert_fail("tag >= 1 && tag < 0x80",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x23e,"void ravi_pushcfastcall(lua_State *, void *, int)");
  }
  (pTVar1->value_).p = ptr;
  pTVar1->tt_ = (ushort)(tag << 8) | 0x46;
  L->top = L->top + 1;
  if (L->ci->top < L->top) {
    __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x23f,"void ravi_pushcfastcall(lua_State *, void *, int)");
  }
  iVar2 = **(int **)&L[-1].hookmask + -1;
  **(int **)&L[-1].hookmask = iVar2;
  if (iVar2 != 0) {
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x240,"void ravi_pushcfastcall(lua_State *, void *, int)");
  }
  return;
}

Assistant:

LUA_API void ravi_pushcfastcall(lua_State *L, void *ptr, int tag) {
  lua_lock(L);
  setfvalue_fastcall(L->top, ptr, tag);
  api_incr_top(L);
  lua_unlock(L);
}